

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O3

int __thiscall HevcPpsUnit::deserialize(HevcPpsUnit *this)

{
  BitStreamReader *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = HevcUnit::deserialize(&this->super_HevcUnit);
  if (iVar2 == 0) {
    uVar3 = HevcUnit::extractUEGolombCode(&this->super_HevcUnit);
    this->pps_id = uVar3;
    iVar2 = 1;
    if (uVar3 < 0x40) {
      uVar3 = HevcUnit::extractUEGolombCode(&this->super_HevcUnit);
      this->sps_id = uVar3;
      if (uVar3 < 0x10) {
        this_00 = &(this->super_HevcUnit).m_reader;
        bVar1 = BitStreamReader::getBit(this_00);
        this->dependent_slice_segments_enabled_flag = bVar1;
        bVar1 = BitStreamReader::getBit(this_00);
        this->output_flag_present_flag = bVar1;
        uVar3 = BitStreamReader::getBits(this_00,3);
        this->num_extra_slice_header_bits = (uint8_t)uVar3;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int HevcPpsUnit::deserialize()
{
    const int rez = HevcUnit::deserialize();
    if (rez)
        return rez;

    try
    {
        pps_id = extractUEGolombCode();
        if (pps_id > 63)
            return 1;
        sps_id = extractUEGolombCode();
        if (sps_id > 15)
            return 1;
        dependent_slice_segments_enabled_flag = m_reader.getBit();
        output_flag_present_flag = m_reader.getBit();
        num_extra_slice_header_bits = m_reader.getBits<uint8_t>(3);

        return 0;
    }
    catch (VodCoreException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}